

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
          (DescriptorIndex<std::pair<const_void_*,_int>_> *this,FileDescriptorProto *file,
          pair<const_void_*,_int> value)

{
  int iVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  LogMessage *pLVar6;
  long lVar7;
  long lVar8;
  pair<const_void_*,_int> value_00;
  pair<const_void_*,_int> value_01;
  pair<const_void_*,_int> value_02;
  pair<const_void_*,_int> value_03;
  pair<const_void_*,_int> value_04;
  pair<const_void_*,_int> value_05;
  string path;
  second_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [56];
  
  local_98.first = value.first;
  local_98.second = value.second;
  bVar4 = InsertIfNotPresent<std::map<std::__cxx11::string,std::pair<void_const*,int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<void_const*,int>>>>>
                    (&this->by_name_,(file->name_).ptr_,&local_98);
  if (!bVar4) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x78);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,"File already exists in database: ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    return false;
  }
  local_68._0_8_ = local_68 + 0x10;
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    local_68._8_8_ = (char *)0x0;
    local_68[0x10] = '\0';
  }
  else {
    psVar2 = (file->package_).ptr_;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar3,pcVar3 + psVar2->_M_string_length);
  }
  if ((char *)local_68._8_8_ != (char *)0x0) {
    std::__cxx11::string::push_back((char)local_68);
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)((file->message_type_).super_RepeatedPtrFieldBase.rep_)->elements
                             [lVar8] + 0xd8));
      value_02.second = local_98.second;
      value_02.first = local_98.first;
      value_02._12_4_ = 0;
      bVar4 = AddSymbol(this,&local_88,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((!bVar4) ||
         (value_00.second = local_98.second, value_00.first = local_98.first, value_00._12_4_ = 0,
         bVar4 = AddNestedExtensions(this,(file->name_).ptr_,
                                     (DescriptorProto *)
                                     ((file->message_type_).super_RepeatedPtrFieldBase.rep_)->
                                     elements[lVar8],value_00), !bVar4)) goto LAB_0030b644;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)((file->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8] +
                      0x60));
      value_03.second = local_98.second;
      value_03.first = local_98.first;
      value_03._12_4_ = 0;
      bVar4 = AddSymbol(this,&local_88,value_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (!bVar4) goto LAB_0030b644;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar8 = 0;
    do {
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)((file->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8] +
                      0x18));
      value_04.second = local_98.second;
      value_04.first = local_98.first;
      value_04._12_4_ = 0;
      bVar4 = AddSymbol(this,&local_88,value_04);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((!bVar4) ||
         (value_01.second = local_98.second, value_01.first = local_98.first, value_01._12_4_ = 0,
         bVar4 = AddExtension(this,(file->name_).ptr_,
                              (FieldDescriptorProto *)
                              ((file->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8],
                              value_01), !bVar4)) goto LAB_0030b644;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = iVar1 < 1;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      std::operator+(&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)((file->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar8] +
                      0x30));
      value_05.second = local_98.second;
      value_05.first = local_98.first;
      value_05._12_4_ = 0;
      bVar5 = AddSymbol(this,&local_88,value_05);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (!bVar5) break;
      lVar8 = lVar8 + 1;
      lVar7 = (long)(file->service_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = lVar7 <= lVar8;
    } while (lVar8 < lVar7);
  }
LAB_0030b646:
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  return bVar4;
LAB_0030b644:
  bVar4 = false;
  goto LAB_0030b646;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}